

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O2

int PKCS12_verify_mac(PKCS12 *p12,char *pass,int passlen)

{
  int iVar1;
  void *pvVar2;
  X509 *cert;
  EVP_PKEY *pkey;
  
  if (pass == (char *)0x0) {
    if (passlen != 0) {
      return 0;
    }
  }
  else if (passlen != -1) {
    if (pass[passlen] != '\0') {
      return 0;
    }
    if ((passlen != 0) && (pvVar2 = memchr(pass,0,(long)passlen), pvVar2 != (void *)0x0)) {
      return 0;
    }
  }
  pkey = (EVP_PKEY *)0x0;
  cert = (X509 *)0x0;
  iVar1 = PKCS12_parse(p12,pass,(EVP_PKEY **)&pkey,(X509 **)&cert,(stack_st_X509 **)0x0);
  if (iVar1 == 0) {
    ERR_clear_error();
  }
  else {
    EVP_PKEY_free((EVP_PKEY *)pkey);
    X509_free((X509 *)cert);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int PKCS12_verify_mac(const PKCS12 *p12, const char *password,
                      int password_len) {
  if (password == NULL) {
    if (password_len != 0) {
      return 0;
    }
  } else if (password_len != -1 &&
             (password[password_len] != 0 ||
              OPENSSL_memchr(password, 0, password_len) != NULL)) {
    return 0;
  }

  EVP_PKEY *pkey = NULL;
  X509 *cert = NULL;
  if (!PKCS12_parse(p12, password, &pkey, &cert, NULL)) {
    ERR_clear_error();
    return 0;
  }

  EVP_PKEY_free(pkey);
  X509_free(cert);

  return 1;
}